

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRequest.cpp
# Opt level: O1

void __thiscall HttpRequest::HttpRequest(HttpRequest *this,URI *uri,MethodType type)

{
  string local_40;
  
  HttpHeader::HttpHeader(&this->super_HttpHeader);
  (this->super_HttpHeader).super_HttpHeaderBase._vptr_HttpHeaderBase =
       (_func_int **)&PTR__HttpRequest_00130570;
  this->mMethod = type;
  URI::URI(&this->mUri,uri);
  URI::getHost_abi_cxx11_(&local_40,uri);
  HttpHeaderBase::addField((HttpHeaderBase *)this,0x3fe,local_40._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  HttpHeader::addDateField(&this->super_HttpHeader);
  return;
}

Assistant:

HttpRequest::HttpRequest( const URI &uri, MethodType type ) : mMethod( type ), mUri( uri )
{
	addField( HttpFieldMap::kFieldHost, uri.getHost().c_str() );
	addDateField();
}